

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::analysis::DebugInfoManager::GetVariableIdOfDebugValueUsedForDeclare
          (DebugInfoManager *this,Instruction *inst)

{
  bool bVar1;
  CommonDebugInfoInstructions CVar2;
  uint32_t uVar3;
  Op OVar4;
  Instruction *pIVar5;
  IRContext *pIVar6;
  DefUseManager *this_00;
  Instruction *var;
  uint32_t var_id;
  uint32_t operation_const;
  Instruction *operation;
  Instruction *expr;
  Instruction *inst_local;
  DebugInfoManager *this_local;
  
  CVar2 = opt::Instruction::GetCommonDebugOpcode(inst);
  if (CVar2 == CommonDebugInfoDebugValue) {
    uVar3 = opt::Instruction::GetSingleWordOperand(inst,6);
    pIVar5 = GetDbgInst(this,uVar3);
    if (pIVar5 == (Instruction *)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      uVar3 = opt::Instruction::NumOperands(pIVar5);
      if (uVar3 == 5) {
        uVar3 = opt::Instruction::GetSingleWordOperand(pIVar5,4);
        pIVar5 = GetDbgInst(this,uVar3);
        if (pIVar5 == (Instruction *)0x0) {
          this_local._4_4_ = 0;
        }
        else {
          bVar1 = opt::Instruction::IsOpenCL100DebugInstr(inst);
          if (bVar1) {
            uVar3 = opt::Instruction::GetSingleWordOperand(pIVar5,4);
            if (uVar3 != 0) {
              return 0;
            }
          }
          else {
            uVar3 = GetVulkanDebugOperation(this,pIVar5);
            if (uVar3 != 0) {
              return 0;
            }
          }
          this_local._4_4_ = opt::Instruction::GetSingleWordOperand(inst,5);
          pIVar6 = context(this);
          bVar1 = IRContext::AreAnalysesValid(pIVar6,kAnalysisBegin);
          if (!bVar1) {
            __assert_fail("false && \"Checking a DebugValue can be used for declare needs DefUseManager\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                          ,0x28c,
                          "uint32_t spvtools::opt::analysis::DebugInfoManager::GetVariableIdOfDebugValueUsedForDeclare(Instruction *)"
                         );
          }
          pIVar6 = context(this);
          this_00 = IRContext::get_def_use_mgr(pIVar6);
          pIVar5 = DefUseManager::GetDef(this_00,this_local._4_4_);
          OVar4 = opt::Instruction::opcode(pIVar5);
          if ((OVar4 != OpVariable) ||
             (uVar3 = opt::Instruction::GetSingleWordOperand(pIVar5,2), uVar3 != 7)) {
            this_local._4_4_ = 0;
          }
        }
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t DebugInfoManager::GetVariableIdOfDebugValueUsedForDeclare(
    Instruction* inst) {
  if (inst->GetCommonDebugOpcode() != CommonDebugInfoDebugValue) return 0;

  auto* expr =
      GetDbgInst(inst->GetSingleWordOperand(kDebugValueOperandExpressionIndex));
  if (expr == nullptr) return 0;
  if (expr->NumOperands() != kDebugExpressOperandOperationIndex + 1) return 0;

  auto* operation = GetDbgInst(
      expr->GetSingleWordOperand(kDebugExpressOperandOperationIndex));
  if (operation == nullptr) return 0;

  // OpenCL.DebugInfo.100 contains a literal for the operation, Vulkan uses an
  // OpConstant.
  if (inst->IsOpenCL100DebugInstr()) {
    if (operation->GetSingleWordOperand(kDebugOperationOperandOperationIndex) !=
        OpenCLDebugInfo100Deref) {
      return 0;
    }
  } else {
    uint32_t operation_const = GetVulkanDebugOperation(operation);
    if (operation_const != NonSemanticShaderDebugInfo100Deref) {
      return 0;
    }
  }

  uint32_t var_id =
      inst->GetSingleWordOperand(kDebugDeclareOperandVariableIndex);
  if (!context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse)) {
    assert(false &&
           "Checking a DebugValue can be used for declare needs DefUseManager");
    return 0;
  }

  auto* var = context()->get_def_use_mgr()->GetDef(var_id);
  if (var->opcode() == spv::Op::OpVariable &&
      spv::StorageClass(
          var->GetSingleWordOperand(kOpVariableOperandStorageClassIndex)) ==
          spv::StorageClass::Function) {
    return var_id;
  }
  return 0;
}